

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

void __thiscall
t_netstd_generator::generate_netstd_struct_equals
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  pointer pcVar2;
  t_type *ptVar3;
  int iVar4;
  ostream *poVar5;
  t_field *ptVar6;
  long lVar7;
  t_netstd_generator *ptVar8;
  char *pcVar9;
  pointer pptVar10;
  string local_170;
  ostream *local_150;
  uint local_144;
  string local_140;
  t_struct *local_120;
  t_netstd_generator *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_120 = tstruct;
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"public override bool Equals(object that)",0x28);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_140._M_dataplus._M_p,local_140._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (!(that is ",0xe);
  type_name_abi_cxx11_(&local_140,this,&local_120->super_t_type,false);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_140._M_dataplus._M_p,local_140._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," other)) return false;",0x16);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"if (ReferenceEquals(this, other)) return true;",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  pptVar10 = (local_120->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (pptVar10 !=
      (local_120->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_144 = (uint)CONCAT71((int7)((ulong)local_120 >> 8),1);
    local_150 = out;
    local_118 = this;
    do {
      poVar5 = local_150;
      if ((local_144 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_150,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_170._M_dataplus._M_p,local_170._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"&& ",3);
        this = local_118;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
          this = local_118;
        }
      }
      else {
        t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_150,local_170._M_dataplus._M_p,local_170._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return ",7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        local_144 = 0;
      }
      ptVar6 = *pptVar10;
      if (ptVar6->req_ != T_REQUIRED) {
        std::__ostream_insert<char,std::char_traits<char>>(local_150,"((__isset.",10);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar2 = ((*pptVar10)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,pcVar2 + ((*pptVar10)->name_)._M_string_length);
        normalize_name(&local_140,this,&local_90,false);
        get_isset_name(&local_170,this,&local_140);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_150,local_170._M_dataplus._M_p,local_170._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," == other.__isset.",0x12);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar2 = ((*pptVar10)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar2,pcVar2 + ((*pptVar10)->name_)._M_string_length);
        ptVar8 = local_118;
        normalize_name(&local_50,local_118,&local_b0,false);
        get_isset_name(&local_110,ptVar8,&local_50);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_110._M_dataplus._M_p,local_110._M_string_length);
        this = local_118;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") && ((!__isset.",0x10);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        pcVar2 = ((*pptVar10)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar2,pcVar2 + ((*pptVar10)->name_)._M_string_length);
        ptVar8 = this;
        normalize_name(&local_70,this,&local_f0,false);
        get_isset_name(&local_d0,ptVar8,&local_70);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") || (",6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        ptVar6 = *pptVar10;
      }
      ptVar3 = ptVar6->type_;
      iVar4 = (*(ptVar3->super_t_doc)._vptr_t_doc[0xd])(ptVar3);
      if (((char)iVar4 == '\0') &&
         (iVar4 = (*(ptVar3->super_t_doc)._vptr_t_doc[7])(ptVar3), (char)iVar4 == '\0')) {
        lVar7 = 0x15;
        pcVar9 = "System.Object.Equals(";
      }
      else {
        lVar7 = 0x14;
        pcVar9 = "TCollections.Equals(";
      }
      poVar5 = local_150;
      std::__ostream_insert<char,std::char_traits<char>>(local_150,pcVar9,lVar7);
      prop_name_abi_cxx11_(&local_170,this,*pptVar10,false);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", other.",8);
      prop_name_abi_cxx11_(&local_140,this,*pptVar10,false);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((*pptVar10)->req_ != T_REQUIRED) {
        std::__ostream_insert<char,std::char_traits<char>>(local_150,")))",3);
      }
      out = local_150;
      pptVar10 = pptVar10 + 1;
    } while (pptVar10 !=
             (local_120->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
    if ((local_144 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_150,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      iVar4 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
      (this->super_t_oop_generator).super_t_generator.indent_ = iVar4;
      goto LAB_002c1b37;
    }
  }
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return true;",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  iVar4 = (this->super_t_oop_generator).super_t_generator.indent_;
LAB_002c1b37:
  (this->super_t_oop_generator).super_t_generator.indent_ = iVar4 + -1;
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_equals(ostream& out, t_struct* tstruct)
{
    out << indent() << "public override bool Equals(object that)" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "if (!(that is " << type_name(tstruct,false) << " other)) return false;" << endl
        << indent() << "if (ReferenceEquals(this, other)) return true;" << endl;


    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    bool first = true;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        if (first)
        {
            first = false;
            out << indent() << "return ";
            indent_up();
        }
        else
        {
            out << endl;
            out << indent() << "&& ";
        }
        if (!field_is_required((*f_iter)))
        {
            out << "((__isset." << get_isset_name(normalize_name((*f_iter)->get_name())) << " == other.__isset."
                << get_isset_name(normalize_name((*f_iter)->get_name())) << ") && ((!__isset."
                << get_isset_name(normalize_name((*f_iter)->get_name())) << ") || (";
        }
        t_type* ttype = (*f_iter)->get_type();
        if (ttype->is_container() || ttype->is_binary())
        {
            out << "TCollections.Equals(";
        }
        else
        {
            out << "System.Object.Equals(";
        }
        out << prop_name((*f_iter)) << ", other." << prop_name((*f_iter)) << ")";
        if (!field_is_required((*f_iter)))
        {
            out << ")))";
        }
    }
    if (first)
    {
        out << indent() << "return true;" << endl;
    }
    else
    {
        out << ";" << endl;
        indent_down();
    }

    indent_down();
    out << indent() << "}" << endl << endl;
}